

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

bool duckdb::IsEnabledOptimizer
               (MetricsType metric,
               set<duckdb::OptimizerType,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
               *disabled_optimizers)

{
  const_iterator cVar1;
  OptimizerType matching_optimizer_type;
  OptimizerType local_c;
  
  local_c = MetricsUtils::GetOptimizerTypeByMetric(metric);
  if ((local_c != INVALID) &&
     (cVar1 = ::std::
              _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
              ::find(&disabled_optimizers->_M_t,&local_c),
     (_Rb_tree_header *)cVar1._M_node == &(disabled_optimizers->_M_t)._M_impl.super__Rb_tree_header)
     ) {
    return true;
  }
  return false;
}

Assistant:

bool IsEnabledOptimizer(MetricsType metric, const set<OptimizerType> &disabled_optimizers) {
	auto matching_optimizer_type = MetricsUtils::GetOptimizerTypeByMetric(metric);
	if (matching_optimizer_type != OptimizerType::INVALID &&
	    disabled_optimizers.find(matching_optimizer_type) == disabled_optimizers.end()) {
		return true;
	}
	return false;
}